

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion.c
# Opt level: O0

void complete_cmd(char *buf,char *hint,linenoiseCompletions *lc)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_240;
  uint local_23c;
  uint i;
  uint match_count;
  char **matches;
  char *pcStack_228;
  char opt [3];
  char *getoptstr;
  char *name;
  char *last;
  size_t name_len;
  autocomplete ac [20];
  linenoiseCompletions *lc_local;
  char *hint_local;
  char *buf_local;
  
  memcpy(&name_len,&DAT_0011ba60,0x1e0);
  matches._5_2_ = 0x3a00;
  matches._7_1_ = 0;
  _i = (char **)0x0;
  local_23c = 0;
  if (buf == hint) {
    get_cmd_completion(hint,(char ***)&i,&local_23c);
  }
  else {
    for (local_240 = 0; local_240 < 0x14; local_240 = local_240 + 1) {
      pcVar4 = commands[*(uint *)&ac[(ulong)local_240 - 1].yl_cb].name;
      sVar3 = strlen(pcVar4);
      iVar2 = strncmp(buf,pcVar4,sVar3);
      if ((iVar2 == 0) && (buf[sVar3] == ' ')) {
        pcVar4 = get_last_str(buf,hint);
        if ((*pcVar4 == '-') && (pcVar4[1] != '\0')) {
          cVar1 = pcVar4[1];
        }
        else {
          cVar1 = '\0';
        }
        matches._5_2_ = CONCAT11(matches._6_1_,cVar1);
        pcStack_228 = commands[*(uint *)&ac[(ulong)local_240 - 1].yl_cb].optstring;
        if (((*(long *)(ac + local_240) != 0) || (cVar1 == '\0')) ||
           (pcVar5 = strstr(pcStack_228,(char *)((long)&matches + 5)), pcVar5 == (char *)0x0)) {
          if ((*(long *)(ac + local_240) != 0) && (matches._5_1_ != '\0')) {
            pcVar5 = *(char **)(ac + local_240);
            sVar3 = strlen(*(char **)(ac + local_240));
            iVar2 = strncmp(pcVar5,pcVar4,sVar3);
            if (iVar2 != 0) goto LAB_0010c20d;
          }
          if ((*(long *)(ac + local_240) == 0) || (matches._5_1_ != '\0')) {
            if (ac[local_240].opt == (char *)0x0) {
              path_completion(hint,lc);
            }
            else {
              (*(code *)ac[local_240].opt)(hint,&i,&local_23c);
            }
            break;
          }
        }
      }
LAB_0010c20d:
    }
  }
  for (local_240 = 0; local_240 < local_23c; local_240 = local_240 + 1) {
    linenoiseAddCompletion(lc,_i[local_240]);
    free(_i[local_240]);
  }
  free(_i);
  return;
}

Assistant:

void
complete_cmd(const char *buf, const char *hint, linenoiseCompletions *lc)
{
    struct autocomplete {
        enum COMMAND_INDEX ci;      /**< command index to global variable 'commands' */
        const char *opt;            /**< optional option */
        void (*yl_cb)(const char *, char ***, unsigned int *);  /**< yanglint callback to call */
    } ac[] = {
        {CMD_ADD,         NULL,    NULL},
        {CMD_PRINT,       "-f",    get_print_format_arg},
        {CMD_PRINT,       "-P",    get_schema_completion},
        {CMD_PRINT,       "-o",    NULL},
        {CMD_PRINT,       NULL,    get_model_completion},
        {CMD_SEARCHPATH,  NULL,    NULL},
        {CMD_EXTDATA,     NULL,    NULL},
        {CMD_CLEAR,       "-Y",    NULL},
        {CMD_DATA,        "-t",    get_data_type_arg},
        {CMD_DATA,        "-O",    NULL},
        {CMD_DATA,        "-R",    NULL},
        {CMD_DATA,        "-f",    get_data_in_format_arg},
        {CMD_DATA,        "-F",    get_data_in_format_arg},
        {CMD_DATA,        "-d",    get_data_default_arg},
        {CMD_DATA,        "-o",    NULL},
        {CMD_DATA,        NULL,    NULL},
        {CMD_LIST,        NULL,    get_list_format_arg},
        {CMD_FEATURE,     NULL,    get_model_completion},
        {CMD_VERB,        NULL,    get_verb_arg},
        {CMD_DEBUG,       NULL,    get_debug_arg},
    };
    size_t name_len;
    const char *last, *name, *getoptstr;
    char opt[3] = {'\0', ':', '\0'};
    char **matches = NULL;
    unsigned int match_count = 0, i;

    if (buf == hint) {
        /* command autocomplete */
        get_cmd_completion(hint, &matches, &match_count);

    } else {
        for (i = 0; i < (sizeof ac / sizeof *ac); ++i) {
            /* Find the right command. */
            name = commands[ac[i].ci].name;
            name_len = strlen(name);
            if (strncmp(buf, name, name_len) || (buf[name_len] != ' ')) {
                /* not this command */
                continue;
            }

            /* Select based on the right option. */
            last = get_last_str(buf, hint);
            opt[0] = (last[0] == '-') && last[1] ? last[1] : '\0';
            getoptstr = commands[ac[i].ci].optstring;
            if (!ac[i].opt && opt[0] && strstr(getoptstr, opt)) {
                /* completion for the argument must be defined */
                continue;
            } else if (ac[i].opt && opt[0] && strncmp(ac[i].opt, last, strlen(ac[i].opt))) {
                /* completion for (another) option */
                continue;
            } else if (ac[i].opt && !opt[0]) {
                /* completion is defined for option */
                continue;
            }

            /* callback */
            if (ac[i].yl_cb) {
                ac[i].yl_cb(hint, &matches, &match_count);
            } else {
                path_completion(hint, lc);
            }
            break;
        }
    }

    /* transform matches into autocompletion, if needed */
    for (i = 0; i < match_count; ++i) {
        linenoiseAddCompletion(lc, matches[i]);
        free(matches[i]);
    }
    free(matches);
}